

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
FindNextProperty_BigPropertyIndex
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          ScriptContext *scriptContext,unsigned_short *index,JavascriptString **propertyStringName,
          PropertyId *propertyId,PropertyAttributes *attributes,Type *type,
          DynamicType *typeToEnumerate,EnumeratorFlags flags,DynamicObject *instance,
          PropertyValueInfo *info)

{
  byte bVar1;
  unsigned_short uVar2;
  DynamicTypeHandler *pDVar3;
  JavascriptString *key;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  PropertyId propertyId_00;
  undefined4 *puVar8;
  ScriptContext *pSVar9;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar10;
  JavascriptString **ppJVar11;
  PropertyString *pPVar12;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar13;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  undefined4 *local_58;
  EnumeratorFlags *local_50;
  ScriptContext *local_48;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *local_40;
  SimpleDictionaryPropertyDescriptor<unsigned_short> local_34 [2];
  SimpleDictionaryPropertyDescriptor<unsigned_short> descriptor;
  
  local_48 = scriptContext;
  local_40 = this;
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f0,"(propertyStringName)","propertyStringName");
    if (!bVar5) goto LAB_00e1d81e;
    *puVar8 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f1,"(propertyId)","propertyId");
    if (!bVar5) goto LAB_00e1d81e;
    *puVar8 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f2,"(type)","type");
    if (!bVar5) goto LAB_00e1d81e;
    *puVar8 = 0;
  }
  if (typeToEnumerate == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f3,"(typeToEnumerate)","typeToEnumerate");
    if (!bVar5) {
LAB_00e1d81e:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  local_50 = attributes;
  if ((DynamicType *)type == typeToEnumerate) {
    uVar7 = (uint)*index;
    pBVar13 = (local_40->propertyMap).ptr;
    if (pBVar13->count - pBVar13->freeCount <= (int)(uint)*index) {
      return 0;
    }
    do {
      pSVar10 = JsUtil::
                BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                ::GetValueAt(pBVar13,uVar7);
      bVar1 = pSVar10->Attributes;
      if (((bVar1 & 0x18) == 0) && (((flags & EnumNonEnumerable) != None || ((bVar1 & 1) != 0)))) {
        ppJVar11 = JsUtil::
                   BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetKeyAt((local_40->propertyMap).ptr,(uint)*index);
        pSVar9 = local_48;
        key = *ppJVar11;
        if (local_50 != (byte *)0x0) {
          *local_50 = bVar1;
        }
        propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(local_48,key);
        *propertyId = propertyId_00;
        pPVar12 = ScriptContext::GetPropertyString(pSVar9,propertyId_00);
        *propertyStringName = &pPVar12->super_JavascriptString;
        return 1;
      }
      uVar2 = *index;
      *index = uVar2 + 1;
      uVar7 = (uint)(ushort)(uVar2 + 1);
      pBVar13 = (local_40->propertyMap).ptr;
    } while ((int)uVar7 < pBVar13->count - pBVar13->freeCount);
  }
  else {
    pDVar3 = (typeToEnumerate->typeHandler).ptr;
    propertyRecord = (PropertyRecord *)(ulong)flags;
    iVar6 = (*pDVar3->_vptr_DynamicTypeHandler[10])
                      (pDVar3,local_48,index,propertyStringName,propertyId,attributes,
                       typeToEnumerate,typeToEnumerate,propertyRecord,instance,info);
    if (iVar6 == 0) {
      return 0;
    }
    local_58 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      local_34[0].Attributes = '\a';
      local_34[0]._0_1_ = (local_34[0]._0_1_ & 0xf0) + 1;
      local_34[0].propertyIndex = 0xffff;
      if (*propertyId == -1) {
        if (*propertyStringName != (JavascriptString *)0x0) {
          bVar5 = JsUtil::
                  BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                  ::TryGetValue<Js::JavascriptString*>
                            ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                              *)(local_40->propertyMap).ptr,propertyStringName,local_34);
          goto LAB_00e1d70f;
        }
      }
      else {
        pSVar9 = Js::Type::GetScriptContext(type);
        local_68 = ScriptContext::GetPropertyName(pSVar9,*propertyId);
        if (((flags & EnumSymbols) == None) && (local_68->isSymbol == true)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = local_58;
          *local_58 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x32c,
                                      "(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol())"
                                      ,
                                      "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols"
                                     );
          if (!bVar5) goto LAB_00e1d81e;
          *puVar8 = 0;
        }
        pBVar13 = (local_40->propertyMap).ptr;
        uVar7 = JsUtil::
                BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                ::FindEntryWithKey<Js::PropertyRecord_const*>
                          ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                            *)pBVar13,&local_68);
        bVar5 = -1 < (int)uVar7;
        attributes = local_50;
        if (bVar5) {
          local_34[0] = *(SimpleDictionaryPropertyDescriptor<unsigned_short> *)
                         ((pBVar13->entries).ptr + uVar7);
        }
LAB_00e1d70f:
        if (((bVar5 != false) && (((uint)local_34[0] & 0x1800) == 0)) &&
           (((local_34[0].Attributes | flags) & EnumNonEnumerable) != None)) {
          if (attributes != (EnumeratorFlags *)0x0) {
            *attributes = local_34[0].Attributes;
          }
          return 1;
        }
      }
      *index = *index + 1;
      iVar6 = (*pDVar3->_vptr_DynamicTypeHandler[10])
                        (pDVar3,local_48,index,propertyStringName,propertyId,attributes,
                         typeToEnumerate,typeToEnumerate,propertyRecord,instance,info);
    } while (iVar6 != 0);
  }
  return 0;
}

Assistant:

inline BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FindNextProperty_BigPropertyIndex(ScriptContext* scriptContext, TPropertyIndex& index,
        JavascriptString** propertyStringName, PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);
        Assert(typeToEnumerate);

        if(type == typeToEnumerate)
        {
            for( ; index < propertyMap->Count(); ++index )
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(index));
                if( !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (descriptor.Attributes & PropertyEnumerable)))
                {
                    auto key = propertyMap->GetKeyAt(index);

                    // Skip this property if it is a symbol and we are not including symbol properties
                    if (!(flags & EnumeratorFlags::EnumSymbols) && TMapKey_IsSymbol(key, scriptContext))
                    {
                        continue;
                    }

                    if (attributes != nullptr)
                    {
                        *attributes = descriptor.Attributes;
                    }

                    *propertyId = TMapKey_GetPropertyId(scriptContext, key);
                    *propertyStringName = scriptContext->GetPropertyString(*propertyId);

                    return TRUE;
                }
            }

            return FALSE;
        }

        // Need to enumerate a different type than the current one. This is because type snapshot enumerate is enabled and the
        // object's type changed since enumeration began, so need to enumerate properties of the initial type.
        DynamicTypeHandler *const typeHandlerToEnumerate = typeToEnumerate->GetTypeHandler();
        for(
            ;
            typeHandlerToEnumerate->FindNextProperty(
                scriptContext,
                index,
                propertyStringName,
                propertyId,
                attributes,
                typeToEnumerate,
                typeToEnumerate,
                flags,
                instance,
                info);
            ++index)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor;
            bool hasValue = false;
            if (*propertyId != Constants::NoProperty)
            {
                PropertyRecord const* propertyRecord = type->GetScriptContext()->GetPropertyName(*propertyId);

                AssertMsg(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol(),
                    "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols");

                hasValue = propertyMap->TryGetValue(propertyRecord, &descriptor);
            }
            else if (*propertyStringName != nullptr)
            {
                hasValue = propertyMap->TryGetValue(*propertyStringName, &descriptor);
            }
            if (hasValue &&
                !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) &&
                (!!(flags & EnumeratorFlags::EnumNonEnumerable) || descriptor.Attributes & PropertyEnumerable))
            {
                if (attributes != nullptr)
                {
                    *attributes = descriptor.Attributes;
                }

                return TRUE;
            }
        }

        return FALSE;
    }